

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DerTypes.h
# Opt level: O3

bool __thiscall AnyType::OutputFromType<Integer>(AnyType *this,ostream *os)

{
  bool bVar1;
  undefined1 local_40 [8];
  Integer t;
  
  t.super_DerBase._vptr_DerBase = (_func_int **)0x0;
  local_40 = (undefined1  [8])&PTR_EncodedSize_00151ab8;
  t.super_DerBase.cbData = 0;
  t.value.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  t.value.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  bVar1 = ConvertToType<Integer>(this,(Integer *)local_40);
  if (bVar1) {
    ::operator<<(os,(Integer *)local_40);
  }
  if (t.super_DerBase.cbData != 0) {
    operator_delete((void *)t.super_DerBase.cbData);
  }
  return bVar1;
}

Assistant:

bool OutputFromType(std::ostream& os) const 
    {
        T t;
        bool fConverted = ConvertToType(t);
        if (fConverted)
            os << t;

        return fConverted;
    }